

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_percentile_tables.cpp
# Opt level: O2

bool is_legal_2d_block_size(uint xdim,uint ydim)

{
  uint uVar1;
  
  uVar1 = xdim << 8 | ydim;
  if ((((5 < uVar1 - 0xa05) || ((0x2bU >> (uVar1 - 0xa05 & 0x1f) & 1) == 0)) &&
      ((3 < uVar1 - 0x805 || (uVar1 - 0x805 == 2)))) &&
     ((((1 < uVar1 - 0x504 && (1 < uVar1 - 0x605)) && (uVar1 != 0x404)) &&
      ((uVar1 != 0xc0a && (uVar1 != 0xc0c)))))) {
    return false;
  }
  return true;
}

Assistant:

bool is_legal_2d_block_size(
	unsigned int xdim,
	unsigned int ydim
) {
	unsigned int idx = (xdim << 8) | ydim;
	switch (idx)
	{
		case 0x0404:
		case 0x0504:
		case 0x0505:
		case 0x0605:
		case 0x0606:
		case 0x0805:
		case 0x0806:
		case 0x0808:
		case 0x0A05:
		case 0x0A06:
		case 0x0A08:
		case 0x0A0A:
		case 0x0C0A:
		case 0x0C0C:
			return true;
	}

	return false;
}